

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  bool bVar3;
  WeightParamType WVar4;
  SimpleRecurrentLayerParams *pSVar5;
  WeightParams *pWVar6;
  string *psVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ActivationParams *params_00;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  byte local_191;
  uint64_t local_190;
  uint64_t recurrent_matrix_size;
  string local_180;
  allocator<char> local_159;
  string local_158;
  byte local_131;
  uint64_t local_130;
  uint64_t input_matrix_size;
  undefined1 local_108 [8];
  string err_1;
  undefined1 local_c8 [8];
  string err;
  WeightParamType biasVectorValueType;
  WeightParamType recursionMatrixValueType;
  WeightParamType weightMatrixValueType;
  bool hasBiasVector;
  SimpleRecurrentLayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,2,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,2,2);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"SimpleRecurrent",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"SimpleRecurrent",(allocator<char> *)((long)&params + 7));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,5,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      pSVar5 = Specification::NeuralNetworkLayer::simplerecurrent(local_20);
      bVar2 = Specification::SimpleRecurrentLayerParams::hasbiasvector(pSVar5);
      pWVar6 = Specification::SimpleRecurrentLayerParams::weightmatrix(pSVar5);
      WVar4 = valueType(pWVar6);
      pWVar6 = Specification::SimpleRecurrentLayerParams::recursionmatrix(pSVar5);
      err.field_2._12_4_ = valueType(pWVar6);
      pWVar6 = Specification::SimpleRecurrentLayerParams::biasvector(pSVar5);
      err.field_2._8_4_ = valueType(pWVar6);
      if (((WVar4 == UNSPECIFIED) || (err.field_2._12_4_ == 4)) ||
         ((bVar2 && (err.field_2._8_4_ == UNSPECIFIED)))) {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        __return_storage_ptr___00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&err_1.field_2 + 8);
        std::operator+(__return_storage_ptr___00,"Simple recurrent layer \'",psVar7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,__return_storage_ptr___00,
                       "\' has invalid weightMatrix/recusionMatrix/Bias fields.");
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_c8);
      }
      else if (((WVar4 == QUINT) || (err.field_2._12_4_ == 2)) ||
              ((WVar4 == err.field_2._12_4_ &&
               (((!bVar2 || (err.field_2._8_4_ == QUINT)) || (WVar4 == err.field_2._8_4_)))))) {
        uVar8 = Specification::SimpleRecurrentLayerParams::inputvectorsize(pSVar5);
        local_130 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
        local_130 = uVar8 * local_130;
        local_131 = 0;
        pWVar6 = Specification::SimpleRecurrentLayerParams::weightmatrix(pSVar5);
        uVar8 = local_130;
        uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"SimpleRNN",&local_159);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"WeightMatrix",
                   (allocator<char> *)((long)&recurrent_matrix_size + 7));
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar6,uVar8,uVar9,&local_158,psVar7,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator((allocator<char> *)((long)&recurrent_matrix_size + 7));
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_131 = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_131 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 == 0) {
          uVar8 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
          local_190 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
          local_190 = uVar8 * local_190;
          local_191 = 0;
          pWVar6 = Specification::SimpleRecurrentLayerParams::recursionmatrix(pSVar5);
          uVar8 = local_190;
          uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,"SimpleRNN",&local_1b9);
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,"RecursionMatrix",&local_1e1);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar6,uVar8,uVar9,&local_1b8,psVar7,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::allocator<char>::~allocator(&local_1e1);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          bVar3 = Result::good(__return_storage_ptr__);
          if (!bVar3) {
            local_191 = 1;
          }
          local_38 = (uint)!bVar3;
          if ((local_191 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 == 0) {
            if (bVar2) {
              local_1e2 = 0;
              pWVar6 = Specification::SimpleRecurrentLayerParams::biasvector(pSVar5);
              uVar8 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar5);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_208,"SimpleRNN",&local_209);
              psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_230,"BiasVector",&local_231);
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar6,uVar8,1,&local_208,psVar7,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::allocator<char>::~allocator(&local_231);
              std::__cxx11::string::~string((string *)&local_208);
              std::allocator<char>::~allocator(&local_209);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                local_1e2 = 1;
              }
              local_38 = (uint)!bVar2;
              if ((local_1e2 & 1) == 0) {
                Result::~Result(__return_storage_ptr__);
              }
              if (local_38 != 0) {
                return __return_storage_ptr__;
              }
            }
            pSVar5 = Specification::NeuralNetworkLayer::simplerecurrent(local_20);
            params_00 = Specification::SimpleRecurrentLayerParams::activation(pSVar5);
            validateRecurrentActivationParams(__return_storage_ptr__,params_00);
          }
        }
      }
      else {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &input_matrix_size,"Simple recurrent layer \'",psVar7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &input_matrix_size,
                       "\' has invalid weightMatrix/recusionMatrix/Bias fields. Field value types should match and should either be half or full precision."
                      );
        std::__cxx11::string::~string((string *)&input_matrix_size);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_108);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden state
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank));
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                                                  params.outputvectorsize(),
                                                                  "SimpleRNN", layer.name(), "WeightMatrix"));

    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                                                  params.outputvectorsize(), "SimpleRNN",
                                                                  layer.name(), "RecursionMatrix"));

    // bias
    if (hasBiasVector){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                                                      "SimpleRNN", layer.name(), "BiasVector"));
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}